

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::openBeamlet_abi_cxx11_(Station *this,int beam,int aperture)

{
  bool bVar1;
  pair<int,_int> pVar2;
  pair<int,_int> diff_00;
  reference pvVar3;
  reference pvVar4;
  int in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  Collimator *in_RDI;
  pair<int,_double> pVar5;
  int i_1;
  int i;
  int row;
  pair<int,_int> coord;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  int in_stack_fffffffffffffec0;
  int iVar6;
  int in_stack_fffffffffffffec4;
  undefined4 uVar7;
  Station *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int iVar8;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffee0;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  pair<int,_int> this_00;
  Collimator *this_01;
  int local_80;
  int local_64;
  int local_34;
  int iStack_30;
  
  this_01 = in_RDI;
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x145f92);
  bVar1 = isActiveBeamlet(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
  if ((bVar1) &&
     (bVar1 = isOpenBeamlet(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                            in_stack_fffffffffffffec0), !bVar1)) {
    pVar2 = Collimator::indexToPos(this_01,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    local_34 = pVar2.first;
    this_00 = pVar2;
    diff_00 = std::make_pair<int&,int&>
                        ((int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                         (int *)0x146043);
    pvVar3 = std::
             vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                           *)(in_RSI + 0x58),(long)in_ECX);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
              (pvVar3,(long)local_34);
    std::make_pair<std::pair<int,int>,std::pair<int,int>&>
              ((pair<int,_int> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (pair<int,_int> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::operator=
              ((pair<std::pair<int,_int>,_std::pair<int,_int>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (type)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    pvVar3 = std::
             vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                           *)(in_RSI + 0x58),(long)in_ECX);
    pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (pvVar3,(long)local_34);
    iStack_30 = pVar2.second;
    if (pvVar4->first < 0) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_ECX);
      pVar5 = std::make_pair<int&,double&>
                        ((int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         (double *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      in_stack_fffffffffffffef8 =
           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)pVar5.second;
      in_stack_ffffffffffffff04 = pVar5.first;
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      push_back((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                (value_type *)in_stack_fffffffffffffec8);
      pvVar3 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RSI + 0x58),(long)in_ECX);
      pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar3,(long)local_34);
      pvVar4->first = iStack_30;
      pvVar3 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RSI + 0x58),(long)in_ECX);
      pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar3,(long)local_34);
      pvVar4->second = iStack_30;
    }
    else {
      pvVar3 = std::
               vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                             *)(in_RSI + 0x58),(long)in_ECX);
      pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar3,(long)local_34);
      if (iStack_30 < pvVar4->first) {
        local_64 = 0;
        while( true ) {
          pvVar3 = std::
                   vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                 *)(in_RSI + 0x58),(long)in_ECX);
          pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[](pvVar3,(long)local_34);
          if (pvVar4->first - iStack_30 <= local_64) break;
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_ECX);
          pVar5 = std::make_pair<int,double&>
                            ((int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                             (double *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                            );
          in_stack_fffffffffffffee0 =
               (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               pVar5.second;
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          push_back((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                    (value_type *)in_stack_fffffffffffffec8);
          local_64 = local_64 + 1;
        }
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar3,(long)local_34);
        pvVar4->first = iStack_30;
        in_stack_fffffffffffffedc = iStack_30;
      }
      else {
        local_80 = 0;
        while( true ) {
          iVar8 = iStack_30;
          in_stack_fffffffffffffed8 = local_80;
          pvVar3 = std::
                   vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                 *)(in_RSI + 0x58),(long)in_ECX);
          pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[](pvVar3,(long)local_34);
          if (iVar8 - pvVar4->second <= in_stack_fffffffffffffed8) break;
          iVar6 = iStack_30;
          uVar7 = in_EDX;
          pvVar3 = std::
                   vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                 *)(in_RSI + 0x58),(long)in_ECX);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                    (pvVar3,(long)local_34);
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(in_RSI + 200),(long)in_ECX);
          pVar5 = std::make_pair<int,double&>
                            ((int *)CONCAT44(uVar7,iVar6),
                             (double *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                            );
          std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
          push_back((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    CONCAT44(iVar8,pVar5.first),(value_type *)pVar5.second);
          local_80 = local_80 + 1;
        }
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)(in_RSI + 0x58),(long)in_ECX);
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar3,(long)local_34);
        pvVar4->second = iStack_30;
      }
    }
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    updateIntensity((Station *)this_00,
                    (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    diff_00);
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x146514);
  }
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
            (in_stack_fffffffffffffee0,
             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  return (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)this_01;
}

Assistant:

list <pair<int,double> > Station::openBeamlet(int beam, int aperture) {
   // cout << "Attempt to open beam: " << beam << endl;
    list<pair<int, double>> diff;
    //cout << "active: " << isActiveBeamlet(beam) << " open: " << isOpenBeamlet(beam, aperture) << " aperture: " << aperture << endl;
    if (isActiveBeamlet(beam) && !isOpenBeamlet(beam, aperture)) {
      auto coord = collimator.indexToPos(beam, angle);
      int row= coord.first;
      //cout << "Coordinates: " << coord.first << "," << coord.second << endl;
      last_mem = make_pair(make_pair(aperture,row), A[aperture][row]);
      if (A[aperture][row].first < 0) {
        //When the row is completely closed
        diff.push_back(make_pair(beam, intensity[aperture]));
        A[aperture][row].first=coord.second;
        A[aperture][row].second=coord.second;
      } else {
        if (A[aperture][row].first > coord.second) {
          for (int i=0;i<(A[aperture][row].first-coord.second);i++)
            diff.push_back(make_pair(beam+i, intensity[aperture]));
          A[aperture][row].first = coord.second;
        } else {
          for (int i=0;i<(coord.second-A[aperture][row].second);i++)
            diff.push_back(make_pair(beam-(coord.second-A[aperture][row].second)+1+i, intensity[aperture]));
          A[aperture][row].second = coord.second;
        }
      }
		 	updateIntensity(diff);
		 //	printIntensity(true);
		}/* else {
		  cout << "Not active or not closed" << endl;
		} */
		last_diff=diff;
		return(diff);
  }